

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int __thiscall fmt::v7::system_error::init(system_error *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  char *in_RCX;
  detail *in_RDX;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  size_t in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  undefined1 local_270 [8];
  memory_buffer buffer;
  string local_48;
  
  this->error_code_ = (int)ctx;
  buffer.super_buffer<char>._vptr_buffer = (_func_int **)&buffer.super_buffer<char>.capacity_;
  buffer.super_buffer<char>.ptr_ = (char *)0x0;
  local_270 = (undefined1  [8])&PTR_grow_002bbc00;
  buffer.super_buffer<char>.size_ = 500;
  format_str.size_ = in_R8;
  format_str.data_ = in_RCX;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)in_R9;
  detail::vformat_abi_cxx11_(&local_48,in_RDX,format_str,args);
  format_system_error((buffer<char> *)local_270,(int)ctx,(string_view)local_48._0_16_);
  std::__cxx11::string::~string((string *)&local_48);
  to_string<char,500ul>(&local_48,(v7 *)local_270,buf);
  std::runtime_error::runtime_error((runtime_error *)(buffer.store_ + 0x1f0),(string *)&local_48);
  std::runtime_error::operator=(&this->super_runtime_error,(runtime_error *)(buffer.store_ + 0x1f0))
  ;
  std::runtime_error::~runtime_error((runtime_error *)(buffer.store_ + 0x1f0));
  std::__cxx11::string::~string((string *)&local_48);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_270);
  return extraout_EAX;
}

Assistant:

FMT_FUNC void system_error::init(int err_code, string_view format_str,
                                 format_args args) {
  error_code_ = err_code;
  memory_buffer buffer;
  format_system_error(buffer, err_code, vformat(format_str, args));
  std::runtime_error& base = *this;
  base = std::runtime_error(to_string(buffer));
}